

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O3

string * cmGeneratorExpression::StripEmptyListElements(string *__return_storage_ptr__,string *input)

{
  size_type sVar1;
  pointer pcVar2;
  char cVar3;
  long lVar4;
  bool bVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  
  lVar4 = std::__cxx11::string::find((char)input,0x3b);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (lVar4 == -1) {
    pcVar2 = (input->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + input->_M_string_length);
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    pcVar6 = (input->_M_dataplus)._M_p;
    cVar3 = *pcVar6;
    if (cVar3 != '\0') {
      pcVar7 = pcVar6;
      bVar5 = true;
      do {
        pcVar7 = pcVar7 + 1;
        bVar8 = cVar3 == ';';
        if ((bool)(bVar5 & bVar8)) {
          std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar6);
          pcVar6 = pcVar7;
        }
        cVar3 = *pcVar7;
        bVar5 = bVar8;
      } while (cVar3 != '\0');
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    sVar1 = __return_storage_ptr__->_M_string_length;
    if ((sVar1 != 0) && ((__return_storage_ptr__->_M_dataplus)._M_p[sVar1 - 1] == ';')) {
      std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)sVar1 + -1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpression::StripEmptyListElements(
                                                    const std::string &input)
{
  if (input.find(';') == input.npos)
    {
    return input;
    }
  std::string result;
  result.reserve(input.size());

  const char *c = input.c_str();
  const char *last = c;
  bool skipSemiColons = true;
  for ( ; *c; ++c)
    {
    if(*c == ';')
      {
      if(skipSemiColons)
        {
        result.append(last, c - last);
        last = c + 1;
        }
      skipSemiColons = true;
      }
    else
      {
      skipSemiColons = false;
      }
    }
  result.append(last);

  if (!result.empty() && *(result.end() - 1) == ';')
    {
    result.resize(result.size() - 1);
    }

  return result;
}